

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall gimage::Histogram::sumRows(Histogram *this,Histogram *colhist)

{
  long lVar1;
  unsigned_long *puVar2;
  Histogram *in_RSI;
  Histogram *in_RDI;
  Histogram *unaff_retaddr;
  int i;
  int k;
  int local_18;
  int local_14;
  
  setSize(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)((ulong)in_RSI >> 0x20));
  clear(in_RDI);
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 4); local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < *(int *)in_RDI; local_18 = local_18 + 1) {
      lVar1 = *(long *)(*(long *)(*(long *)(in_RDI + 0x18) + (long)local_14 * 8) +
                       (long)local_18 * 8);
      puVar2 = operator()(in_RSI,local_18,1);
      *puVar2 = lVar1 + *puVar2;
    }
  }
  return;
}

Assistant:

void Histogram::sumRows(Histogram &colhist) const
{
  colhist.setSize(w, 1, bs);
  colhist.clear();

  for (int k=0; k<h; k++)
  {
    for (int i=0; i<w; i++)
    {
      colhist(i, 1)+=row[k][i];
    }
  }
}